

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc_combis.c
# Opt level: O2

void prefix_sum(void *a,void *a0,void *xs,bsc_size_t size)

{
  int iVar1;
  ulong uVar2;
  int *zero;
  ulong uVar3;
  
  iVar1 = *a0;
  uVar3 = 0;
  uVar2 = (ulong)(uint)(size >> 2);
  if (size >> 2 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + *(int *)((long)xs + uVar3 * 4);
    *(int *)((long)a + uVar3 * 4) = iVar1;
  }
  return;
}

Assistant:

void prefix_sum( void * a, const void * a0, const void * xs, bsc_size_t size )
{
    int * result = a;
    const int * zero = a0;
    const int * nums = xs;
    int i, n = size/sizeof(int);
    int accu = *zero;

    for ( i = 0; i < n ; ++i ) {
        accu += nums[i];
        result[i] = accu;
    }
}